

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O1

char * toStringFp(double t,int digits10)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  
  __s = (char *)operator_new__(0x80);
  iVar1 = qFpClassify(t);
  if (iVar1 == 0) {
    pcVar2 = "nan";
  }
  else {
    if (iVar1 != 1) {
      snprintf(__s,0x80,"%.*g (%a)",t,t,digits10);
      return __s;
    }
    pcVar2 = "inf";
    if (t < 0.0) {
      pcVar2 = "-inf";
    }
  }
  qstrncpy(__s,pcVar2,0x80);
  return __s;
}

Assistant:

static char *toStringFp(double t, int digits10)
{
    char *msg = new char[128];
    switch (qFpClassify(t)) {
    case FP_INFINITE:
        qstrncpy(msg, (t < 0 ? "-inf" : "inf"), 128);
        break;
    case FP_NAN:
        qstrncpy(msg, "nan", 128);
        break;
    default:
        std::snprintf(msg, 128, "%.*g (%a)", digits10, t, t);
        break;
    }
    return msg;
}